

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise.h
# Opt level: O0

void gimage::addScaledNoise<float>(Image<float,_gimage::PixelTraits<float>_> *image,float stddev)

{
  int iVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  Image<float,_gimage::PixelTraits<float>_> *in_RDI;
  work_t wVar5;
  store_t_conflict sVar6;
  double v;
  double r2;
  double r1;
  long i;
  long k;
  long d;
  double vmax;
  double vmin;
  double stddev_00;
  double *ret2;
  double *in_stack_ffffffffffffffa0;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  long local_38;
  double local_30;
  double *local_28;
  double local_20;
  double local_18 [2];
  Image<float,_gimage::PixelTraits<float>_> *local_8;
  
  local_8 = in_RDI;
  wVar5 = Image<float,_gimage::PixelTraits<float>_>::absMinValue
                    ((Image<float,_gimage::PixelTraits<float>_> *)0x16b1c2);
  local_18[0] = (double)wVar5;
  wVar5 = Image<float,_gimage::PixelTraits<float>_>::absMaxValue
                    ((Image<float,_gimage::PixelTraits<float>_> *)0x16b1d9);
  local_20 = (double)wVar5;
  local_28 = (double *)0x0;
  while( true ) {
    ret2 = local_28;
    iVar1 = Image<float,_gimage::PixelTraits<float>_>::getDepth(local_8);
    if ((long)iVar1 <= (long)ret2) break;
    local_30 = 0.0;
    while( true ) {
      stddev_00 = local_30;
      lVar2 = Image<float,_gimage::PixelTraits<float>_>::getHeight(local_8);
      if (lVar2 <= (long)stddev_00) break;
      local_38 = 0;
      while( true ) {
        lVar2 = local_38;
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
        if (lVar3 <= lVar2) break;
        getBoxMuller(in_stack_ffffffffffffffa0,ret2,stddev_00);
        sVar6 = Image<float,_gimage::PixelTraits<float>_>::get
                          (local_8,local_38,(long)local_30,(int)local_28);
        local_50 = (double)sVar6;
        local_58 = local_50 + (local_40 * local_50) / local_20;
        pdVar4 = std::min<double>(&local_20,&local_58);
        pdVar4 = std::max<double>(local_18,pdVar4);
        local_50 = *pdVar4;
        Image<float,_gimage::PixelTraits<float>_>::set
                  (local_8,local_38,(long)local_30,(int)local_28,(float)local_50);
        lVar2 = local_38 + 1;
        lVar3 = Image<float,_gimage::PixelTraits<float>_>::getWidth(local_8);
        if (lVar2 < lVar3) {
          sVar6 = Image<float,_gimage::PixelTraits<float>_>::get
                            (local_8,local_38 + 1,(long)local_30,(int)local_28);
          local_50 = (double)sVar6;
          in_stack_ffffffffffffffa0 = (double *)(local_50 + (local_48 * local_50) / local_20);
          pdVar4 = std::min<double>(&local_20,(double *)&stack0xffffffffffffffa0);
          pdVar4 = std::max<double>(local_18,pdVar4);
          local_50 = *pdVar4;
          Image<float,_gimage::PixelTraits<float>_>::set
                    (local_8,local_38 + 1,(long)local_30,(int)local_28,(float)local_50);
        }
        local_38 = local_38 + 2;
      }
      local_30 = (double)((long)local_30 + 1);
    }
    local_28 = (double *)((long)local_28 + 1);
  }
  return;
}

Assistant:

void addScaledNoise(Image<T> &image, float stddev)
{
  double vmin=image.absMinValue();
  double vmax=image.absMaxValue();

  for (long d=0; d<image.getDepth(); d++)
  {
    for (long k=0; k<image.getHeight(); k++)
    {
      for (long i=0; i<image.getWidth(); i+=2)
      {
        double r1, r2;
        getBoxMuller(r1, r2, stddev);

        double v=image.get(i, k, d);
        v=std::max(vmin, std::min(vmax, v+r1*v/vmax));
        image.set(i, k, d, static_cast<typename Image<T>::store_t>(v));

        if (i+1 < image.getWidth())
        {
          v=image.get(i+1, k, d);
          v=std::max(vmin, std::min(vmax, v+r2*v/vmax));
          image.set(i+1, k, d, static_cast<typename Image<T>::store_t>(v));
        }
      }
    }
  }
}